

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void pcacheManageDirtyList(PgHdr *pPage,u8 addRemove)

{
  PCache *pPVar1;
  PgHdr *pPVar2;
  PgHdr *pPVar3;
  
  pPVar1 = pPage->pCache;
  if ((addRemove & 1) != 0) {
    if (pPVar1->pSynced == pPage) {
      pPVar1->pSynced = pPage->pDirtyPrev;
    }
    pPVar2 = pPage->pDirtyNext;
    pPVar3 = pPage->pDirtyPrev;
    if (pPVar2 == (PgHdr *)0x0) {
      pPVar1->pDirtyTail = pPVar3;
      if (pPVar3 == (PgHdr *)0x0) {
        pPVar1->pDirty = (PgHdr *)0x0;
        pPVar1->eCreate = '\x02';
        goto LAB_00147843;
      }
    }
    else {
      pPVar2->pDirtyPrev = pPVar3;
      if (pPVar3 == (PgHdr *)0x0) {
        pPVar1->pDirty = pPVar2;
        goto LAB_00147843;
      }
    }
    pPVar3->pDirtyNext = pPVar2;
  }
LAB_00147843:
  if ((addRemove & 2) != 0) {
    pPage->pDirtyPrev = (PgHdr *)0x0;
    pPVar2 = pPVar1->pDirty;
    pPage->pDirtyNext = pPVar2;
    if (pPVar2 == (PgHdr *)0x0) {
      pPVar1->pDirtyTail = pPage;
      if (pPVar1->bPurgeable != '\0') {
        pPVar1->eCreate = '\x01';
      }
    }
    else {
      pPVar2->pDirtyPrev = pPage;
    }
    pPVar1->pDirty = pPage;
    if ((pPVar1->pSynced == (PgHdr *)0x0) && ((pPage->flags & 8) == 0)) {
      pPVar1->pSynced = pPage;
      return;
    }
  }
  return;
}

Assistant:

static void pcacheManageDirtyList(PgHdr *pPage, u8 addRemove){
  PCache *p = pPage->pCache;

  pcacheTrace(("%p.DIRTYLIST.%s %d\n", p,
                addRemove==1 ? "REMOVE" : addRemove==2 ? "ADD" : "FRONT",
                pPage->pgno));
  if( addRemove & PCACHE_DIRTYLIST_REMOVE ){
    assert( pPage->pDirtyNext || pPage==p->pDirtyTail );
    assert( pPage->pDirtyPrev || pPage==p->pDirty );

    /* Update the PCache1.pSynced variable if necessary. */
    if( p->pSynced==pPage ){
      p->pSynced = pPage->pDirtyPrev;
    }

    if( pPage->pDirtyNext ){
      pPage->pDirtyNext->pDirtyPrev = pPage->pDirtyPrev;
    }else{
      assert( pPage==p->pDirtyTail );
      p->pDirtyTail = pPage->pDirtyPrev;
    }
    if( pPage->pDirtyPrev ){
      pPage->pDirtyPrev->pDirtyNext = pPage->pDirtyNext;
    }else{
      /* If there are now no dirty pages in the cache, set eCreate to 2.
      ** This is an optimization that allows sqlite3PcacheFetch() to skip
      ** searching for a dirty page to eject from the cache when it might
      ** otherwise have to.  */
      assert( pPage==p->pDirty );
      p->pDirty = pPage->pDirtyNext;
      assert( p->bPurgeable || p->eCreate==2 );
      if( p->pDirty==0 ){         /*OPTIMIZATION-IF-TRUE*/
        assert( p->bPurgeable==0 || p->eCreate==1 );
        p->eCreate = 2;
      }
    }
  }
  if( addRemove & PCACHE_DIRTYLIST_ADD ){
    pPage->pDirtyPrev = 0;
    pPage->pDirtyNext = p->pDirty;
    if( pPage->pDirtyNext ){
      assert( pPage->pDirtyNext->pDirtyPrev==0 );
      pPage->pDirtyNext->pDirtyPrev = pPage;
    }else{
      p->pDirtyTail = pPage;
      if( p->bPurgeable ){
        assert( p->eCreate==2 );
        p->eCreate = 1;
      }
    }
    p->pDirty = pPage;

    /* If pSynced is NULL and this page has a clear NEED_SYNC flag, set
    ** pSynced to point to it. Checking the NEED_SYNC flag is an
    ** optimization, as if pSynced points to a page with the NEED_SYNC
    ** flag set sqlite3PcacheFetchStress() searches through all newer
    ** entries of the dirty-list for a page with NEED_SYNC clear anyway.  */
    if( !p->pSynced
     && 0==(pPage->flags&PGHDR_NEED_SYNC)   /*OPTIMIZATION-IF-FALSE*/
    ){
      p->pSynced = pPage;
    }
  }
  pcacheDump(p);
}